

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

value_type * __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::value_or<char_const*const&>
          (value_type *__return_storage_ptr__,optional<tinyusdz::Token> *this,char **v)

{
  bool bVar1;
  value_type *pvVar2;
  char **v_local;
  optional<tinyusdz::Token> *this_local;
  
  bVar1 = has_value(this);
  if (bVar1) {
    pvVar2 = detail::storage_t<tinyusdz::Token>::value
                       ((storage_t<tinyusdz::Token> *)&this->contained);
    tinyusdz::Token::Token(__return_storage_ptr__,pvVar2);
  }
  else {
    tinyusdz::Token::Token(__return_storage_ptr__,*v);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr14 value_type value_or( U && v ) optional_refref_qual
    {
        return has_value() ? std::move( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
    }